

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O2

void __thiscall fmp4_stream::mvhd::parse(mvhd *this,char *ptr)

{
  char cVar1;
  uint uVar2;
  
  cVar1 = ptr[8];
  (this->super_full_box).super_box.field_0x62 = cVar1;
  uVar2 = *(uint *)(ptr + (ulong)(cVar1 == '\x01') * 8 + 0x14);
  this->time_scale_ =
       uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  return;
}

Assistant:

void mvhd::parse(char const *ptr)
	{
		this->version_ = (unsigned int)ptr[8];

		if (version_ == 1)
			this->time_scale_ = fmp4_read_uint32(ptr + 12 + 8 + 8);
		else
			this->time_scale_ = fmp4_read_uint32(ptr + 12 + 8);

		return;
	}